

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextBuildAddWindowsToNodes(ImGuiContext *ctx,ImGuiID root_id)

{
  ImGuiWindow *window;
  ImGuiDockNode *pIVar1;
  ImGuiDockNode *node;
  ImGuiDockNode *pIVar2;
  long lVar3;
  
  if (0 < (ctx->Windows).Size) {
    lVar3 = 0;
    do {
      window = (ctx->Windows).Data[lVar3];
      if (((window->DockId != 0) && (ctx->FrameCount + -1 <= window->LastFrameActive)) &&
         (window->DockNode == (ImGuiDockNode *)0x0)) {
        node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,window->DockId);
        if (node == (ImGuiDockNode *)0x0) {
          __assert_fail("node != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2fcc,
                        "void ImGui::DockContextBuildAddWindowsToNodes(ImGuiContext *, ImGuiID)");
        }
        pIVar1 = node;
        if (root_id != 0) {
          do {
            pIVar2 = pIVar1;
            pIVar1 = pIVar2->ParentNode;
          } while (pIVar1 != (ImGuiDockNode *)0x0);
          if (pIVar2->ID != root_id) goto LAB_0013bd73;
        }
        DockNodeAddWindow(node,window,true);
      }
LAB_0013bd73:
      lVar3 = lVar3 + 1;
    } while (lVar3 < (ctx->Windows).Size);
  }
  return;
}

Assistant:

void ImGui::DockContextBuildAddWindowsToNodes(ImGuiContext* ctx, ImGuiID root_id)
{
    // Rebind all windows to nodes (they can also lazily rebind but we'll have a visible glitch during the first frame)
    ImGuiContext& g = *ctx;
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (window->DockId == 0 || window->LastFrameActive < g.FrameCount - 1)
            continue;
        if (window->DockNode != NULL)
            continue;

        ImGuiDockNode* node = DockContextFindNodeByID(ctx, window->DockId);
        IM_ASSERT(node != NULL);   // This should have been called after DockContextBuildNodesFromSettings()
        if (root_id == 0 || DockNodeGetRootNode(node)->ID == root_id)
            DockNodeAddWindow(node, window, true);
    }
}